

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshUtilities.cpp
# Opt level: O0

void Rml::MeshUtilities::GenerateBackgroundBorder
               (Mesh *out_mesh,RenderBox *render_box,ColourbPremultiplied background_color,
               ColourbPremultiplied *border_colors)

{
  code *pcVar1;
  Vector2f inner_size;
  Vector2f outer_position;
  EdgeSizes *pEVar2;
  Vector<int> *this;
  bool bVar3;
  const_reference pvVar4;
  size_type sVar5;
  reference piVar6;
  EdgeSizes EVar7;
  CornerSizes outer_radii_def;
  bool local_17d;
  iterator iStack_178;
  int index;
  iterator __end1;
  iterator __begin1;
  Vector<int> *__range1;
  int num_vertices;
  undefined1 local_110 [8];
  BorderMetrics metrics;
  GeometryBackgroundBorder geometry;
  int estimated_num_triangles;
  int estimated_num_vertices;
  bool has_border;
  float fStack_5c;
  bool has_background;
  Vector2f fill_size;
  int i;
  int num_borders;
  float afStack_48 [2];
  array<float,_4UL> *local_40;
  EdgeSizes *border_widths;
  Vector<int> *indices;
  Vector<Vertex> *vertices;
  ColourbPremultiplied *border_colors_local;
  RenderBox *render_box_local;
  Mesh *out_mesh_local;
  ColourbPremultiplied background_color_local;
  
  vertices = (Vector<Vertex> *)border_colors;
  border_colors_local = (ColourbPremultiplied *)render_box;
  render_box_local = (RenderBox *)out_mesh;
  out_mesh_local._4_4_ = background_color;
  if ((border_colors == (ColourbPremultiplied *)0x0) &&
     (bVar3 = Assert("RMLUI_ASSERT(border_colors)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/MeshUtilities.cpp"
                     ,0x58), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  indices = (Vector<int> *)render_box_local;
  border_widths = (EdgeSizes *)((render_box_local->border_widths)._M_elems + 2);
  EVar7 = RenderBox::GetBorderWidths((RenderBox *)border_colors_local);
  afStack_48 = EVar7._M_elems._8_8_;
  _i = EVar7._M_elems._0_8_;
  local_40 = (array<float,_4UL> *)&i;
  fill_size.y = 0.0;
  for (fill_size.x = 0.0; (int)fill_size.x < 4; fill_size.x = (float)((int)fill_size.x + 1)) {
    if ((*(char *)((long)&(vertices->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>).
                          _M_impl.super__Vector_impl_data._M_start + (long)(int)fill_size.x * 4 + 3)
         != '\0') &&
       (pvVar4 = ::std::array<float,_4UL>::operator[](local_40,(long)(int)fill_size.x),
       0.0 < *pvVar4)) {
      fill_size.y = (float)((int)fill_size.y + 1);
    }
  }
  inner_size = RenderBox::GetFillSize((RenderBox *)border_colors_local);
  this = indices;
  local_17d = false;
  if (out_mesh_local._7_1_ != '\0') {
    estimated_num_vertices = (int)inner_size.x;
    local_17d = false;
    if (0.0 < (float)estimated_num_vertices) {
      fStack_5c = inner_size.y;
      local_17d = 0.0 < fStack_5c;
    }
  }
  if ((local_17d != false) || (0 < (int)fill_size.y)) {
    sVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::size
                      ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)indices);
    ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::reserve
              ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)this,
               (long)(int)((int)sVar5 + (int)fill_size.y * 2 + (uint)local_17d * 4));
    pEVar2 = border_widths;
    sVar5 = ::std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)border_widths);
    ::std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)pEVar2,
               (long)(int)((int)sVar5 + ((int)fill_size.y * 2 + (uint)local_17d * 2) * 3));
    GeometryBackgroundBorder::GeometryBackgroundBorder
              ((GeometryBackgroundBorder *)(metrics.inner_radii._M_elems + 3),
               (Vector<Vertex> *)indices,(Vector<int> *)border_widths);
    outer_position = RenderBox::GetBorderOffset((RenderBox *)border_colors_local);
    EVar7._M_elems = *&local_40->_M_elems;
    outer_radii_def = RenderBox::GetBorderRadius((RenderBox *)border_colors_local);
    GeometryBackgroundBorder::ComputeBorderMetrics
              ((BorderMetrics *)local_110,outer_position,EVar7,inner_size,outer_radii_def);
    if (local_17d != false) {
      GeometryBackgroundBorder::DrawBackground
                ((GeometryBackgroundBorder *)(metrics.inner_radii._M_elems + 3),
                 (BorderMetrics *)local_110,out_mesh_local._4_4_);
    }
    if (0 < (int)fill_size.y) {
      GeometryBackgroundBorder::DrawBorder
                ((GeometryBackgroundBorder *)(metrics.inner_radii._M_elems + 3),
                 (BorderMetrics *)local_110,(EdgeSizes)*&local_40->_M_elems,
                 (ColourbPremultiplied *)vertices);
    }
    sVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::size
                      ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)indices);
    pEVar2 = border_widths;
    __end1 = ::std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)border_widths);
    iStack_178 = ::std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)pEVar2);
    while (bVar3 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffe88), bVar3) {
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end1);
      if (((int)sVar5 <= *piVar6) &&
         (bVar3 = Assert("RMLUI_ASSERT(index < num_vertices)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/MeshUtilities.cpp"
                         ,0x8d), !bVar3)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1);
    }
  }
  return;
}

Assistant:

void MeshUtilities::GenerateBackgroundBorder(Mesh& out_mesh, const RenderBox& render_box, ColourbPremultiplied background_color,
	const ColourbPremultiplied border_colors[4])
{
	RMLUI_ASSERT(border_colors);

	Vector<Vertex>& vertices = out_mesh.vertices;
	Vector<int>& indices = out_mesh.indices;

	const EdgeSizes& border_widths = render_box.GetBorderWidths();
	int num_borders = 0;
	for (int i = 0; i < 4; i++)
		if (border_colors[i].alpha > 0 && border_widths[i] > 0)
			num_borders += 1;

	const Vector2f fill_size = render_box.GetFillSize();
	const bool has_background = (background_color.alpha > 0 && fill_size.x > 0 && fill_size.y > 0);
	const bool has_border = (num_borders > 0);

	if (!has_background && !has_border)
		return;

	// Reserve geometry. A conservative estimate, does not take border-radii into account and assumes same-colored borders.
	const int estimated_num_vertices = 4 * int(has_background) + 2 * num_borders;
	const int estimated_num_triangles = 2 * int(has_background) + 2 * num_borders;
	vertices.reserve((int)vertices.size() + estimated_num_vertices);
	indices.reserve((int)indices.size() + 3 * estimated_num_triangles);

	// Generate the geometry.
	GeometryBackgroundBorder geometry(vertices, indices);
	const BorderMetrics metrics =
		GeometryBackgroundBorder::ComputeBorderMetrics(render_box.GetBorderOffset(), border_widths, fill_size, render_box.GetBorderRadius());

	if (has_background)
		geometry.DrawBackground(metrics, background_color);

	if (has_border)
		geometry.DrawBorder(metrics, border_widths, border_colors);

#if 0
	// Debug draw vertices
	if (render_box.border_radius != CornerSizes{})
	{
		const int num_vertices = (int)vertices.size();
		const int num_indices = (int)indices.size();
		vertices.reserve(num_vertices + 4 * num_vertices);
		indices.reserve(num_indices + 6 * num_indices);

		for (int i = 0; i < num_vertices; i++)
			MeshUtilities::GenerateQuad(out_mesh, vertices[i].position, Vector2f(3, 3), ColourbPremultiplied(255, 0, (i % 2) == 0 ? 0 : 255));
	}
#endif

#ifdef RMLUI_DEBUG
	const int num_vertices = (int)vertices.size();
	for (int index : indices)
	{
		RMLUI_ASSERT(index < num_vertices);
	}
#endif
}